

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

RegexPattern *
Js::JavascriptRegExp::CreatePattern(Var aValue,Var options,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t csz;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  JavascriptLibrary *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar7;
  RegexPattern *pattern;
  JavascriptString *strOptions;
  char16 *szOptions;
  int cOpts;
  char16 *szRegex;
  JavascriptString *pJStack_40;
  int cBody;
  JavascriptString *strBody;
  ScriptContext *scriptContext_local;
  Var options_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId;
  
  bVar2 = VarIs<Js::JavascriptString>(aValue);
  if (bVar2) {
    pJStack_40 = VarTo<Js::JavascriptString>(aValue);
  }
  else {
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(this);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (local_18 == TypeIds_Undefined) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      pJStack_40 = JavascriptLibrary::GetEmptyString(this_00);
    }
    else {
      pJStack_40 = JavascriptConversion::ToString(aValue,scriptContext);
    }
  }
  csz = JavascriptString::GetLength(pJStack_40);
  iVar4 = (*(pJStack_40->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
  szOptions._4_4_ = 0;
  strOptions = (JavascriptString *)0x0;
  if ((options != (Var)0x0) &&
     (BVar3 = Js::JavascriptOperators::IsUndefinedObject(options), BVar3 == 0)) {
    bVar2 = VarIs<Js::JavascriptString>(options);
    if (bVar2) {
      pattern = (RegexPattern *)VarTo<Js::JavascriptString>(options);
    }
    else {
      pattern = (RegexPattern *)JavascriptConversion::ToString(options,scriptContext);
    }
    iVar5 = (*(pattern->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    strOptions = (JavascriptString *)CONCAT44(extraout_var_00,iVar5);
    szOptions._4_4_ = JavascriptString::GetLength((JavascriptString *)pattern);
  }
  pRVar7 = RegexHelper::CompileDynamic
                     (scriptContext,(char16 *)CONCAT44(extraout_var,iVar4),csz,(char16 *)strOptions,
                      szOptions._4_4_,false);
  return pRVar7;
}

Assistant:

UnifiedRegex::RegexPattern* JavascriptRegExp::CreatePattern(Var aValue, Var options, ScriptContext *scriptContext)
    {
        JavascriptString * strBody;

        if (VarIs<JavascriptString>(aValue))
        {
            strBody = VarTo<JavascriptString>(aValue);
        }
        else if (JavascriptOperators::GetTypeId(aValue) == TypeIds_Undefined)
        {
            strBody = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            strBody = JavascriptConversion::ToString(aValue, scriptContext); // must be null terminated!
        }

        int cBody = strBody->GetLength();
        const char16 *szRegex = strBody->GetSz();
        int cOpts = 0;
        const char16 *szOptions = nullptr;

        JavascriptString * strOptions = nullptr;
        if (options != nullptr && !JavascriptOperators::IsUndefinedObject(options))
        {
            if (VarIs<JavascriptString>(options))
            {
                strOptions = VarTo<JavascriptString>(options);
            }
            else
            {
                strOptions = JavascriptConversion::ToString(options, scriptContext);
            }

            szOptions = strOptions->GetSz(); // must be null terminated!
            cOpts = strOptions->GetLength();
        }

        UnifiedRegex::RegexPattern* pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);

        return pattern;
    }